

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t determine_blockSize(ZSTD_sequenceFormat_e mode,size_t blockSize,size_t remaining,
                          ZSTD_Sequence *inSeqs,size_t inSeqsSize,ZSTD_sequencePosition seqPos)

{
  ZSTD_sequencePosition seqPos_00;
  uint uVar1;
  ZSTD_Sequence *in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  int in_EDI;
  size_t in_R8;
  size_t err_code;
  size_t explicitBlockSize;
  size_t local_8;
  
  if (in_EDI == 0) {
    local_8 = blockSize_noDelimiter(in_RSI,in_RDX);
  }
  else {
    seqPos_00.posInSrc = in_RSI;
    seqPos_00._0_8_ = in_RDX;
    local_8 = blockSize_explicitDelimiter(in_RCX,in_R8,seqPos_00);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      if (in_RSI < local_8) {
        local_8 = 0xffffffffffffff95;
      }
      else if (in_RDX < local_8) {
        local_8 = 0xffffffffffffff95;
      }
    }
  }
  return local_8;
}

Assistant:

static size_t determine_blockSize(ZSTD_sequenceFormat_e mode,
                           size_t blockSize, size_t remaining,
                     const ZSTD_Sequence* inSeqs, size_t inSeqsSize, ZSTD_sequencePosition seqPos)
{
    DEBUGLOG(6, "determine_blockSize : remainingSize = %zu", remaining);
    if (mode == ZSTD_sf_noBlockDelimiters)
        return blockSize_noDelimiter(blockSize, remaining);
    {   size_t const explicitBlockSize = blockSize_explicitDelimiter(inSeqs, inSeqsSize, seqPos);
        FORWARD_IF_ERROR(explicitBlockSize, "Error while determining block size with explicit delimiters");
        if (explicitBlockSize > blockSize)
            RETURN_ERROR(externalSequences_invalid, "sequences incorrectly define a too large block");
        if (explicitBlockSize > remaining)
            RETURN_ERROR(externalSequences_invalid, "sequences define a frame longer than source");
        return explicitBlockSize;
    }
}